

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

void __thiscall MIDIStreamer::MusicVolumeChanged(MIDIStreamer *this)

{
  int iVar1;
  uint uVar2;
  DWORD volume;
  float fVar3;
  float fVar4;
  
  volume = 0xffff;
  if (this->MIDI != (MIDIDevice *)0x0) {
    iVar1 = (*this->MIDI->_vptr_MIDIDevice[0xe])();
    if ((char)iVar1 != '\0') {
      fVar3 = relative_volume * snd_musicvolume.Value;
      if (1.0 <= fVar3) {
        fVar3 = 1.0;
      }
      fVar4 = 0.0;
      if (0.0 <= fVar3) {
        fVar4 = fVar3;
      }
      uVar2 = (uint)(long)(fVar4 * 65535.0);
      volume = 0xffff;
      if (uVar2 < 0xffff) {
        volume = uVar2;
      }
    }
  }
  this->Volume = volume;
  if ((this->super_MusInfo).m_Status == STATE_Playing) {
    OutputVolume(this,volume);
    return;
  }
  return;
}

Assistant:

void MIDIStreamer::MusicVolumeChanged()
{
	if (MIDI != NULL && MIDI->FakeVolume())
	{
		float realvolume = clamp<float>(snd_musicvolume * relative_volume, 0.f, 1.f);
		Volume = clamp<DWORD>((DWORD)(realvolume * 65535.f), 0, 65535);
	}
	else
	{
		Volume = 0xFFFF;
	}
	if (m_Status == STATE_Playing)
	{
		OutputVolume(Volume);
	}
}